

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O3

int light_ip_flow(light_pcapng *sectionp,light_pcapng **flows,size_t *flow_count,size_t *dropped)

{
  uint8_t uVar1;
  uint *puVar2;
  uint32_t *puVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  light_boolean lVar7;
  int iVar8;
  void *__ptr;
  _flow_information *p_Var9;
  flow_information_t *pfVar10;
  _light_pcapng *p_Var11;
  light_pcapng *pp_Var12;
  light_option option;
  byte bVar13;
  long lVar14;
  byte *pbVar15;
  long lVar16;
  ulong uVar17;
  ushort uVar18;
  light_pcapng p_Var19;
  light_pcapng p_Var20;
  flow_information_t *to_be_deleted;
  _flow_information *__ptr_00;
  _light_pcapng *pcapng;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  flow_information_t *local_a8;
  size_t local_98;
  address_t local_88;
  undefined1 local_78 [16];
  light_pcapng *local_68;
  light_pcapng local_60;
  light_pcapng local_58;
  ulong local_50;
  size_t *local_48;
  double local_40;
  ulong local_38;
  
  p_Var20 = *sectionp;
  local_68 = sectionp;
  uVar6 = light_get_block_count(p_Var20);
  lVar7 = __is_section_header(p_Var20);
  if (lVar7 == LIGHT_FALSE) {
    light_ip_flow_cold_1();
    iVar8 = -1;
  }
  else {
    pcapng = p_Var20->next_block;
    *flow_count = 0;
    local_48 = dropped;
    if (pcapng == (_light_pcapng *)0x0) {
      bVar5 = true;
      __ptr = (void *)0x0;
      __ptr_00 = (flow_information_t *)0x0;
      local_98 = 0;
    }
    else {
      local_50 = 0;
      local_40 = (double)uVar6;
      lVar16 = 0;
      local_98 = 0;
      local_a8 = (flow_information_t *)0x0;
      __ptr_00 = (flow_information_t *)0x0;
      __ptr = (void *)0x0;
      p_Var19 = (light_pcapng)0x0;
      local_60 = p_Var20;
      local_38 = (ulong)uVar6;
      do {
        uVar17 = local_50;
        uVar6 = pcapng->block_type;
        if (uVar6 == 1) {
          uVar21 = (ulong)((int)local_50 + 1);
          __ptr = realloc(__ptr,uVar21 * 8);
          *(_light_pcapng **)((long)__ptr + (uVar17 & 0xffffffff) * 8) = pcapng;
          p_Var19 = pcapng;
          local_50 = uVar21;
          goto LAB_00104867;
        }
        if (uVar6 == 0xa0d0d0a) {
          *local_68 = pcapng;
          bVar5 = false;
          goto LAB_00104907;
        }
        if ((uVar6 != 6) && (uVar6 != 3)) goto LAB_00104867;
        local_78 = ZEXT816(0);
        local_88 = (address_t)ZEXT816(0);
        if (uVar6 == 6) {
          lVar14 = 0x14;
LAB_00104673:
          puVar2 = pcapng->block_body;
          pbVar15 = (byte *)((long)puVar2 + lVar14 + 0xe);
          uVar18 = *(ushort *)((long)puVar2 + lVar14 + 0xc);
          uVar18 = uVar18 << 8 | uVar18 >> 8;
          if (uVar18 < 0x86dd) {
            if (uVar18 != 0x800) {
              if (uVar18 != 0x8100) goto LAB_001046e7;
              pbVar15 = (byte *)((long)puVar2 + lVar14 + 0x12);
            }
          }
          else if (uVar18 != 0x86dd) {
            if (uVar18 != 0x9100) goto LAB_001046e7;
            pbVar15 = (byte *)((long)puVar2 + lVar14 + 0x14);
          }
          bVar13 = *pbVar15 >> 4;
          if (bVar13 == 6) {
            auVar22 = *(undefined1 (*) [16])(pbVar15 + 8);
            auVar23._0_2_ = auVar22._0_2_ >> 8;
            auVar23._2_2_ = auVar22._2_2_ >> 8;
            auVar23._4_2_ = auVar22._4_2_ >> 8;
            auVar23._6_2_ = auVar22._6_2_ >> 8;
            auVar23._8_2_ = auVar22._8_2_ >> 8;
            auVar23._10_2_ = auVar22._10_2_ >> 8;
            auVar23._12_2_ = auVar22._12_2_ >> 8;
            auVar23._14_2_ = auVar22._14_2_ >> 8;
            auVar22 = psllw(auVar22,8);
            local_88 = (address_t)(auVar22 | auVar23);
            auVar22 = *(undefined1 (*) [16])(pbVar15 + 0x18);
            auVar24._0_2_ = auVar22._0_2_ >> 8;
            auVar24._2_2_ = auVar22._2_2_ >> 8;
            auVar24._4_2_ = auVar22._4_2_ >> 8;
            auVar24._6_2_ = auVar22._6_2_ >> 8;
            auVar24._8_2_ = auVar22._8_2_ >> 8;
            auVar24._10_2_ = auVar22._10_2_ >> 8;
            auVar24._12_2_ = auVar22._12_2_ >> 8;
            auVar24._14_2_ = auVar22._14_2_ >> 8;
            local_78 = psllw(auVar22,8);
            local_78 = local_78 | auVar24;
          }
          else {
            if (bVar13 != 4) goto LAB_001046e7;
            local_88 = (address_t)ZEXT416(*(uint *)(pbVar15 + 0xc));
            local_78 = ZEXT416(*(uint *)(pbVar15 + 0x10));
          }
          local_58 = p_Var19;
          if (__ptr_00 == (flow_information_t *)0x0) {
            if (uVar6 != 3) {
              p_Var19 = *(light_pcapng *)((long)__ptr + (ulong)*puVar2 * 8);
            }
            p_Var9 = __create_flow(local_60,p_Var19,(flow_address_t *)&local_88,bVar13);
            *flow_count = 1;
            pfVar10 = p_Var9;
            local_a8 = p_Var9;
            if (p_Var9 != (flow_information_t *)0x0) {
LAB_00104844:
              p_Var11 = __copy_block(pcapng,LIGHT_FALSE);
              p_Var9->last_block->next_block = p_Var11;
              p_Var9->last_block = p_Var11;
              __ptr_00 = pfVar10;
              p_Var19 = local_58;
              goto LAB_00104867;
            }
            local_a8 = (flow_information_t *)0x0;
          }
          else {
            p_Var9 = __ptr_00;
            do {
              if ((p_Var9->version == bVar13) &&
                 (((((lVar14 = *(long *)&(p_Var9->address).source, pfVar10 = __ptr_00,
                     lVar14 == local_88._0_8_ &&
                     (*(long *)((long)&(p_Var9->address).source + 8) == local_88._8_8_)) &&
                    (*(long *)&(p_Var9->address).destination == local_78._0_8_)) &&
                   (*(long *)((long)&(p_Var9->address).destination + 8) == local_78._8_8_)) ||
                  (((lVar14 == local_78._0_8_ &&
                    (*(long *)((long)&(p_Var9->address).source + 8) == local_78._8_8_)) &&
                   ((*(long *)&(p_Var9->address).destination == local_88._0_8_ &&
                    (*(long *)((long)&(p_Var9->address).destination + 8) == local_88._8_8_))))))))
              goto LAB_00104844;
              p_Var9 = p_Var9->next;
            } while (p_Var9 != (_flow_information *)0x0);
          }
          p_Var19 = local_58;
          p_Var20 = local_58;
          if (uVar6 != 3) {
            p_Var20 = *(light_pcapng *)((long)__ptr + (ulong)*pcapng->block_body * 8);
          }
          pfVar10 = __create_flow(local_60,p_Var20,(flow_address_t *)&local_88,bVar13);
          local_a8->next = pfVar10;
          *flow_count = *flow_count + 1;
          local_a8 = pfVar10;
        }
        else {
          if (uVar6 == 3) {
            lVar14 = 4;
            goto LAB_00104673;
          }
LAB_001046e7:
          local_98 = local_98 + 1;
        }
LAB_00104867:
        lVar16 = lVar16 + 1;
        if (((ulong)(lVar16 * -0x2d77318fc504816f) >> 4 | lVar16 * -0x2d77318fc504816f << 0x3c) <
            0x68db8bac710cc) {
          auVar22._8_4_ = (int)((ulong)lVar16 >> 0x20);
          auVar22._0_8_ = lVar16;
          auVar22._12_4_ = 0x45300000;
          printf("Flow extraction progress: %.2lf [%zu / %zu]\n",
                 (((auVar22._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) / local_40) *
                 100.0,lVar16,local_38);
        }
        pcapng = pcapng->next_block;
      } while (pcapng != (_light_pcapng *)0x0);
      bVar5 = true;
    }
LAB_00104907:
    if (local_48 != (size_t *)0x0) {
      *local_48 = local_98;
    }
    if (bVar5) {
      *local_68 = (light_pcapng)0x0;
    }
    pp_Var12 = (light_pcapng *)calloc(*flow_count,8);
    *flows = pp_Var12;
    if (__ptr_00 != (flow_information_t *)0x0) {
      uVar17 = 0;
      p_Var9 = __ptr_00;
      do {
        (*flows)[uVar17] = p_Var9->section;
        __validate_section((*flows)[uVar17]);
        p_Var20 = p_Var9->section;
        bVar13 = (p_Var9->version == '\x06') * ' ' + 1;
        if (p_Var9->version == '\x04') {
          bVar13 = 9;
        }
        option = light_alloc_option((ushort)bVar13);
        option->custom_option_code = 0xadd4;
        puVar3 = option->data;
        uVar1 = p_Var9->version;
        *(uint8_t *)puVar3 = uVar1;
        if (uVar1 == '\x06') {
          uVar4 = *(undefined8 *)((long)&(p_Var9->address).source + 8);
          *(undefined8 *)((long)puVar3 + 1) = *(undefined8 *)&(p_Var9->address).source;
          *(undefined8 *)((long)puVar3 + 9) = uVar4;
          uVar4 = *(undefined8 *)((long)&(p_Var9->address).destination + 8);
          *(undefined8 *)((long)puVar3 + 0x11) = *(undefined8 *)&(p_Var9->address).destination;
          *(undefined8 *)((long)puVar3 + 0x19) = uVar4;
        }
        else if (uVar1 == '\x04') {
          *(anon_union_4_2_095bb53e_for_ipv4 *)((long)puVar3 + 1) = (p_Var9->address).source.ipv4;
          *(anon_union_4_2_095bb53e_for_ipv4 *)((long)puVar3 + 5) =
               (p_Var9->address).destination.ipv4;
        }
        light_add_option(p_Var20,p_Var9->section,option,LIGHT_FALSE);
        uVar17 = (ulong)((int)uVar17 + 1);
        p_Var9 = p_Var9->next;
      } while (p_Var9 != (_flow_information *)0x0);
      do {
        p_Var9 = __ptr_00->next;
        free(__ptr_00);
        __ptr_00 = p_Var9;
      } while (p_Var9 != (_flow_information *)0x0);
    }
    free(__ptr);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int light_ip_flow(light_pcapng *sectionp, light_pcapng **flows, size_t *flow_count, size_t *dropped)
{
	light_pcapng section = *sectionp;
	size_t progress = 0;
	size_t limit = light_get_block_count(*sectionp);
	size_t skipped = 0;

	if (__is_section_header(section) == 0) {
		PCAPNG_ERROR("Invalid section header");
		return LIGHT_INVALID_SECTION;
	}

	light_pcapng current_section = section;
	light_pcapng current_interface = NULL;
	light_pcapng *interface_list = NULL;
	uint32_t interface_list_size = 0;

	flow_information_t *current_flow = NULL;
	flow_information_t *last_flow = NULL;
	light_pcapng current_block = section->next_block;

	*flow_count = 0;

	while (current_block != NULL) {
		uint32_t type = current_block->block_type;
		if (type == LIGHT_SECTION_HEADER_BLOCK) {
			// current_section = current_block;
			*sectionp = current_block;
			break;
		}
		else if (type == LIGHT_INTERFACE_BLOCK) {
			current_interface = current_block;
			interface_list = realloc(interface_list, (interface_list_size + 1) * sizeof(light_pcapng));
			interface_list[interface_list_size] = current_interface;
			interface_list_size++;
		}
		else if (type == LIGHT_ENHANCED_PACKET_BLOCK || type == LIGHT_SIMPLE_PACKET_BLOCK) {
			flow_address_t flow_key = {0};
			uint8_t protocol_version;
			flow_information_t *match = NULL;

			if (__get_address(current_block, &flow_key, &protocol_version) == LIGHT_FALSE) {
				skipped++;
				goto iterate;
			}

			if (current_flow == NULL) { // Beginning of the trace.
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					current_flow = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					current_flow = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}
				match = current_flow;
				last_flow = current_flow;
				*flow_count = 1;
			}
			else {
				match = __find_flow(current_flow, &flow_key, protocol_version);
			}

			if (match == NULL) {
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					match = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					match = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}

				last_flow->next = match;
				last_flow = match;
				*flow_count += 1;
			}
			else {
				match->last_block->next_block = __copy_block(current_block, LIGHT_FALSE);
				match->last_block = match->last_block->next_block;
			}
		}
		else {
			// TODO: Append other blocks to all flows accordingly.
		}

iterate:
		progress++;
		if (progress % 10000 == 0) {
			printf("Flow extraction progress: %.2lf [%zu / %zu]\n", (double)progress / limit * 100.0, progress, limit);
		}
		current_block = current_block->next_block;
	}

	if (dropped != NULL) {
		*dropped = skipped;
	}

	// End of trace.
	if (current_block == NULL) {
		*sectionp = NULL;
	}

	*flows = calloc(*flow_count, sizeof(light_pcapng));
	uint32_t index = 0;
	flow_information_t *iterator = current_flow;

	while (iterator != NULL) {
		(*flows)[index] = iterator->section;
		__validate_section((*flows)[index]);
		__append_address_information(iterator->section, iterator);
		index++;
		iterator = iterator->next;
	}

	while (current_flow != NULL) {
		flow_information_t *to_be_deleted = current_flow;
		current_flow = current_flow->next;
		free(to_be_deleted);
	}

	free(interface_list);

	return LIGHT_SUCCESS;
}